

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O0

type __thiscall
chrono::ChFunctorArchiveInSpecific<chrono::ChVector<double>>::_archive_in<chrono::ChVector<double>>
          (ChFunctorArchiveInSpecific<chrono::ChVector<double>> *this,ChArchiveIn *marchive)

{
  ChArchiveIn *marchive_local;
  ChFunctorArchiveInSpecific<chrono::ChVector<double>_> *this_local;
  
  ChVector<double>::ArchiveIN(*(ChVector<double> **)(this + 8),marchive);
  return;
}

Assistant:

typename enable_if< ChDetect_ArchiveIN<Tc>::value, void >::type
        _archive_in(ChArchiveIn& marchive) {
            this->pt2Object->ArchiveIN(marchive);
        }